

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

_Bool do_cmd_disarm_test(loc grid)

{
  _Bool _Var1;
  char *fmt;
  
  _Var1 = square_isknown(cave,grid);
  if (_Var1) {
    _Var1 = square_iscloseddoor(cave,grid);
    if ((_Var1) && (_Var1 = square_islockeddoor(cave,grid), !_Var1)) {
      return true;
    }
    _Var1 = square_isdisarmabletrap(cave,grid);
    if (_Var1) {
      return true;
    }
    fmt = "You see nothing there to disarm.";
  }
  else {
    fmt = "You see nothing there.";
  }
  msg(fmt);
  return false;
}

Assistant:

static bool do_cmd_disarm_test(struct loc grid)
{
	/* Must have knowledge */
	if (!square_isknown(cave, grid)) {
		msg("You see nothing there.");
		return false;
	}

	/* Look for a closed, unlocked door to lock */
	if (square_iscloseddoor(cave, grid) && !square_islockeddoor(cave, grid))
		return true;

	/* Look for a trap */
	if (!square_isdisarmabletrap(cave, grid)) {
		msg("You see nothing there to disarm.");
		return false;
	}

	/* Okay */
	return true;
}